

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrcmap.c
# Opt level: O0

FT_UInt pfr_cmap_char_index(PFR_CMap cmap,FT_UInt32 char_code)

{
  FT_UInt FVar1;
  FT_UInt mid;
  PFR_Char gchar;
  uint local_20;
  FT_UInt max;
  FT_UInt min;
  FT_UInt32 char_code_local;
  PFR_CMap cmap_local;
  
  local_20 = 0;
  FVar1 = cmap->num_chars;
  while( true ) {
    gchar._4_4_ = FVar1;
    if (gchar._4_4_ <= local_20) {
      return 0;
    }
    FVar1 = local_20 + (gchar._4_4_ - local_20 >> 1);
    if (cmap->chars[FVar1].char_code == char_code) break;
    if (cmap->chars[FVar1].char_code < char_code) {
      local_20 = FVar1 + 1;
      FVar1 = gchar._4_4_;
    }
  }
  return FVar1 + 1;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  pfr_cmap_char_index( PFR_CMap   cmap,
                       FT_UInt32  char_code )
  {
    FT_UInt  min = 0;
    FT_UInt  max = cmap->num_chars;


    while ( min < max )
    {
      PFR_Char  gchar;
      FT_UInt   mid;


      mid   = min + ( max - min ) / 2;
      gchar = cmap->chars + mid;

      if ( gchar->char_code == char_code )
        return mid + 1;

      if ( gchar->char_code < char_code )
        min = mid + 1;
      else
        max = mid;
    }
    return 0;
  }